

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::Negate_InPlace
              (Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  Var pvVar6;
  JavascriptNumber *pJVar7;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  double value;
  
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a9a1f5;
    *puVar5 = 0;
LAB_00a9a0e6:
    this = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a9a1f5;
      *puVar5 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_BigInt) {
        pvVar6 = JavascriptBigInt::Negate(aRight);
        return pvVar6;
      }
      goto LAB_00a9a1d1;
    }
    BVar4 = RecyclableObject::IsExternal(this);
    if (BVar4 != 0) goto LAB_00a9a1d1;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  else {
    if ((undefined1 *)aRight == &DAT_1000000000000) {
      return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).negativeZero.ptr;
    }
    if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)aRight >> 0x32 != 0 || ((ulong)aRight & 0xffff000000000000) == 0x1000000000000)
      goto LAB_00a9a1d1;
      goto LAB_00a9a0e6;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar3) {
LAB_00a9a1f5:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00a9a1d1:
  value = Negate_Helper(aRight,scriptContext);
  pJVar7 = JavascriptNumber::InPlaceNew(value,scriptContext,result);
  return pJVar7;
}

Assistant:

Var JavascriptMath::Negate_InPlace(Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_NegateInPlace);
            // Special case for zero. Must return -0
            if( aRight == TaggedInt::ToVarUnchecked(0) )
            {
                return scriptContext->GetLibrary()->GetNegativeZero();
            }

            if (JavascriptOperators::GetTypeId(aRight) == TypeIds_BigInt)
            {
                return JavascriptBigInt::Negate(aRight);
            }

            double value = Negate_Helper(aRight, scriptContext);
            return JavascriptNumber::InPlaceNew(value, scriptContext, result);
            JIT_HELPER_END(Op_NegateInPlace);
        }